

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O3

Result __thiscall wabt::WastParser::ParseInstr(WastParser *this,ExprList *exprs)

{
  Expr *pEVar1;
  bool bVar2;
  TokenType TVar3;
  Result RVar4;
  _Head_base<0UL,_wabt::Expr_*,_false> _Var5;
  ExprList *pEVar6;
  unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> expr;
  _Head_base<0UL,_wabt::Expr_*,_false> local_18;
  
  TVar3 = Peek(this,0);
  bVar2 = anon_unknown_1::IsPlainInstr(TVar3);
  if (bVar2) {
    local_18._M_head_impl = (Expr *)0x0;
    RVar4 = ParsePlainInstr(this,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)
                                 &local_18);
    _Var5._M_head_impl = local_18._M_head_impl;
    if (RVar4.enum_ == Error) {
LAB_0018838e:
      if (local_18._M_head_impl == (Expr *)0x0) {
        return (Result)Error;
      }
      (*(local_18._M_head_impl)->_vptr_Expr[1])();
      return (Result)Error;
    }
    local_18._M_head_impl = (Expr *)0x0;
  }
  else {
    TVar3 = Peek(this,0);
    if ((0x3c < TVar3 - Block) ||
       ((0x1800000008400001U >> ((ulong)(TVar3 - Block) & 0x3f) & 1) == 0)) {
      bVar2 = PeekMatchExpr(this);
      if (bVar2) {
        RVar4 = ParseExpr(this,exprs);
        return (Result)RVar4.enum_;
      }
      __assert_fail("!\"ParseInstr should only be called when IsInstr() is true\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/wast-parser.cc"
                    ,0x85d,"Result wabt::WastParser::ParseInstr(ExprList *)");
    }
    local_18._M_head_impl = (Expr *)0x0;
    RVar4 = ParseBlockInstr(this,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)
                                 &local_18);
    _Var5._M_head_impl = local_18._M_head_impl;
    if (RVar4.enum_ == Error) goto LAB_0018838e;
  }
  if ((((_Var5._M_head_impl)->super_intrusive_list_base<wabt::Expr>).prev_ == (Expr *)0x0) &&
     (((_Var5._M_head_impl)->super_intrusive_list_base<wabt::Expr>).next_ == (Expr *)0x0)) {
    pEVar1 = exprs->last_;
    pEVar6 = exprs;
    if (pEVar1 != (Expr *)0x0) {
      ((_Var5._M_head_impl)->super_intrusive_list_base<wabt::Expr>).prev_ = pEVar1;
      pEVar6 = (ExprList *)&pEVar1->super_intrusive_list_base<wabt::Expr>;
    }
    pEVar6->first_ = _Var5._M_head_impl;
    exprs->last_ = _Var5._M_head_impl;
    exprs->size_ = exprs->size_ + 1;
    return (Result)Ok;
  }
  __assert_fail("node->prev_ == nullptr && node->next_ == nullptr",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/intrusive-list.h"
                ,0x1bd,
                "void wabt::intrusive_list<wabt::Expr>::push_back(std::unique_ptr<T>) [T = wabt::Expr]"
               );
}

Assistant:

Result WastParser::ParseInstr(ExprList* exprs) {
  WABT_TRACE(ParseInstr);
  if (IsPlainInstr(Peek())) {
    std::unique_ptr<Expr> expr;
    CHECK_RESULT(ParsePlainInstr(&expr));
    exprs->push_back(std::move(expr));
    return Result::Ok;
  } else if (IsBlockInstr(Peek())) {
    std::unique_ptr<Expr> expr;
    CHECK_RESULT(ParseBlockInstr(&expr));
    exprs->push_back(std::move(expr));
    return Result::Ok;
  } else if (PeekMatchExpr()) {
    return ParseExpr(exprs);
  } else {
    assert(!"ParseInstr should only be called when IsInstr() is true");
    return Result::Error;
  }
}